

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_light.cpp
# Opt level: O1

bool __thiscall ON_Light::IsLinearLight(ON_Light *this)

{
  return this->m_style == world_linear_light;
}

Assistant:

const bool ON_Light::IsLinearLight() const
{
  bool rc;
  switch(m_style)
  {
  //case ON::view_linear_light:
  //case ON::camera_linear_light:
  case ON::world_linear_light:
    rc = true;
    break;
  default:
    rc = false;
    break;
  }
  return rc;
}